

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstr.c
# Opt level: O0

ssize_t mpt_memrstr(iovec *data,size_t ndat,void *match,size_t mlen)

{
  int *piVar1;
  void *local_40;
  iovec tmp;
  size_t mlen_local;
  void *match_local;
  size_t ndat_local;
  iovec *data_local;
  
  if (mlen == 0) {
    data_local = (iovec *)0x0;
  }
  else {
    local_40 = match;
    tmp.iov_base = (void *)mlen;
    tmp.iov_len = mlen;
    if (match == (void *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 0xe;
      data_local = (iovec *)0xffffffffffffffff;
    }
    else {
      data_local = (iovec *)mpt_memrfcn(data,ndat,memchr_wrap,&local_40);
    }
  }
  return (ssize_t)data_local;
}

Assistant:

extern ssize_t mpt_memrstr(const struct iovec *data, size_t ndat, const void *match, size_t mlen)
{
	struct iovec	tmp;
	
	if ( !(tmp.iov_len = mlen) )
		return 0;
	
	if ( (tmp.iov_base = (void *) match) == NULL ) {
		errno = EFAULT; return -1;
	}
	return mpt_memrfcn(data, ndat, (int (*)(int , void *)) memchr_wrap, &tmp);
}